

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O2

void __thiscall ycqian::thread_pool::thread_pool(thread_pool *this,size_t size)

{
  bool bVar1;
  thread local_40;
  __shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::make_shared<ycqian::thread_pool::data>();
  while (bVar1 = size != 0, size = size - 1, bVar1) {
    std::__shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,(__shared_ptr<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2> *)this
              );
    std::thread::thread<ycqian::thread_pool::thread_pool(unsigned_long)::_lambda()_1_,,void>
              (&local_40,(anon_class_16_1_898a9ca8_for__M_head_impl *)&local_38);
    std::thread::detach();
    std::thread::~thread(&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  return;
}

Assistant:

explicit thread_pool(size_t size) : data_(std::make_shared<data>()) {
            for (size_t i = 0; i < size; ++i) {
                std::thread([data = data_]{
                    std::unique_lock<std::mutex> lk(data->mutex);
                    for (;;) {
                        if (data->tasks.size()>0) {
                            auto current = data->tasks.front();
                            data->tasks.pop();
                            lk.unlock();
                            current();
                            lk.lock();
                        } else if (data->shutdown) {
                            break;
                        } else {
                            data->cv.wait(lk);
                        }
                    }
                }).detach();
            }
        }